

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.h
# Opt level: O3

int pybind11_clear(PyObject *self)

{
  long *plVar1;
  undefined8 *puVar2;
  
  puVar2 = (undefined8 *)_PyObject_GetDictPtr();
  plVar1 = (long *)*puVar2;
  if (plVar1 != (long *)0x0) {
    *puVar2 = 0;
    *plVar1 = *plVar1 + -1;
    if (*plVar1 == 0) {
      _Py_Dealloc();
    }
  }
  return 0;
}

Assistant:

inline int pybind11_clear(PyObject *self) {
#if PY_VERSION_HEX >= 0x030D0000
    PyObject_ClearManagedDict(self);
#else
    PyObject *&dict = *_PyObject_GetDictPtr(self);
    Py_CLEAR(dict);
#endif
    return 0;
}